

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DualMappedPointerVector.hpp
# Opt level: O0

optional<unsigned_long> __thiscall
gmlc::containers::
DualMappedPointerVector<helics::EndpointInfo,std::__cxx11::string,helics::InterfaceHandle>::
insert<helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
          (DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *searchValue1,
          InterfaceHandle *searchValue2,GlobalHandle *data,
          basic_string_view<char,_std::char_traits<char>_> *data_1,
          basic_string_view<char,_std::char_traits<char>_> *data_2)

{
  bool bVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  vector<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>
  *in_RDI;
  optional<unsigned_long> oVar3;
  size_type index;
  iterator fnd2;
  iterator fnd;
  unordered_map<helics::InterfaceHandle,_unsigned_long,_std::hash<helics::InterfaceHandle>,_std::equal_to<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_unsigned_long>_>_>
  *in_stack_ffffffffffffff48;
  unsigned_long *__t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff61;
  unsigned_long local_78;
  size_type local_70;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff98;
  _Node_iterator_base<std::pair<const_helics::InterfaceHandle,_unsigned_long>,_false>
  in_stack_ffffffffffffffa0;
  _Node_iterator_base<std::pair<const_helics::InterfaceHandle,_unsigned_long>,_false>
  in_stack_ffffffffffffffa8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  local_50;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  local_48 [7];
  _Storage<unsigned_long,_true> local_10;
  undefined1 local_8;
  
  local_48[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
       ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               *)in_stack_ffffffffffffff48,(key_type *)0x5b5892);
  local_50._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              *)in_stack_ffffffffffffff48);
  bVar1 = std::__detail::operator==(local_48,&local_50);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    in_stack_ffffffffffffffa8._M_cur =
         (__node_type *)
         std::
         unordered_map<helics::InterfaceHandle,_unsigned_long,_std::hash<helics::InterfaceHandle>,_std::equal_to<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_unsigned_long>_>_>
         ::find(in_stack_ffffffffffffff48,(key_type *)0x5b58d7);
    in_stack_ffffffffffffffa0._M_cur =
         (__node_type *)
         std::
         unordered_map<helics::InterfaceHandle,_unsigned_long,_std::hash<helics::InterfaceHandle>,_std::equal_to<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_unsigned_long>_>_>
         ::end(in_stack_ffffffffffffff48);
    bVar1 = std::__detail::operator==
                      ((_Node_iterator_base<std::pair<const_helics::InterfaceHandle,_unsigned_long>,_false>
                        *)&stack0xffffffffffffffa8,
                       (_Node_iterator_base<std::pair<const_helics::InterfaceHandle,_unsigned_long>,_false>
                        *)&stack0xffffffffffffffa0);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      std::optional<unsigned_long>::optional((optional<unsigned_long> *)&local_10);
      uVar2 = extraout_RDX;
      goto LAB_005b59dc;
    }
  }
  local_70 = std::
             vector<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>
             ::size(in_RDI);
  __t = &local_78;
  std::
  make_unique<helics::EndpointInfo,helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
            ((GlobalHandle *)in_stack_ffffffffffffffa8._M_cur,
             (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffffa0._M_cur,
             in_stack_ffffffffffffff98);
  std::
  vector<std::unique_ptr<helics::EndpointInfo,std::default_delete<helics::EndpointInfo>>,std::allocator<std::unique_ptr<helics::EndpointInfo,std::default_delete<helics::EndpointInfo>>>>
  ::emplace_back<std::unique_ptr<helics::EndpointInfo,std::default_delete<helics::EndpointInfo>>>
            ((vector<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>
              *)CONCAT71(in_stack_ffffffffffffff61,in_stack_ffffffffffffff60),
             (unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_> *)
             in_stack_ffffffffffffff58);
  std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>::~unique_ptr
            ((unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_> *)
             CONCAT71(in_stack_ffffffffffffff61,in_stack_ffffffffffffff60));
  std::
  unordered_map<std::__cxx11::string,unsigned_long,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
  ::emplace<std::__cxx11::string_const&,unsigned_long&>
            ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              *)CONCAT71(in_stack_ffffffffffffff61,in_stack_ffffffffffffff60),
             in_stack_ffffffffffffff58,(unsigned_long *)in_RDI);
  std::
  unordered_map<helics::InterfaceHandle,unsigned_long,std::hash<helics::InterfaceHandle>,std::equal_to<helics::InterfaceHandle>,std::allocator<std::pair<helics::InterfaceHandle_const,unsigned_long>>>
  ::emplace<helics::InterfaceHandle_const&,unsigned_long&>
            ((unordered_map<helics::InterfaceHandle,_unsigned_long,_std::hash<helics::InterfaceHandle>,_std::equal_to<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_unsigned_long>_>_>
              *)CONCAT71(in_stack_ffffffffffffff61,in_stack_ffffffffffffff60),
             (InterfaceHandle *)in_stack_ffffffffffffff58,(unsigned_long *)in_RDI);
  CLI::std::optional<unsigned_long>::optional<unsigned_long,_true>
            ((optional<unsigned_long> *)in_RDI,__t);
  uVar2 = extraout_RDX_00;
LAB_005b59dc:
  oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._9_7_ = (undefined7)((ulong)uVar2 >> 8);
  oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged = (bool)local_8;
  oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = local_10._M_value;
  return (optional<unsigned_long>)
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<size_t> insert(
            const searchType1& searchValue1,
            const searchType2& searchValue2,
            Us&&... data)
        {
            auto fnd = lookup1.find(searchValue1);
            if (fnd != lookup1.end()) {
                auto fnd2 = lookup2.find(searchValue2);
                if (fnd2 != lookup2.end()) {
                    return std::nullopt;
                }
            }
            auto index = dataStorage.size();
            dataStorage.emplace_back(
                std::make_unique<VType>(std::forward<Us>(data)...));
            lookup1.emplace(searchValue1, index);
            lookup2.emplace(searchValue2, index);
            return index;
        }